

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O2

void Curl_llist_insert_next(Curl_llist *list,Curl_llist_element *e,void *p,Curl_llist_element *ne)

{
  size_t sVar1;
  Curl_llist *pCVar2;
  Curl_llist *pCVar3;
  
  ne->ptr = p;
  sVar1 = list->size;
  if (sVar1 == 0) {
    list->head = ne;
    pCVar2 = (Curl_llist *)&list->tail;
    ne->prev = (Curl_llist_element *)0x0;
    ne->next = (Curl_llist_element *)0x0;
  }
  else {
    pCVar2 = (Curl_llist *)&e->next;
    pCVar3 = pCVar2;
    if (e == (Curl_llist_element *)0x0) {
      pCVar3 = list;
    }
    ne->next = pCVar3->head;
    ne->prev = e;
    if (e == (Curl_llist_element *)0x0) {
      list->head->prev = ne;
      pCVar2 = list;
    }
    else {
      pCVar3 = *(Curl_llist **)pCVar2;
      if (*(Curl_llist **)pCVar2 == (Curl_llist *)0x0) {
        pCVar3 = list;
      }
      pCVar3->tail = ne;
    }
  }
  pCVar2->head = ne;
  list->size = sVar1 + 1;
  return;
}

Assistant:

void
Curl_llist_insert_next(struct Curl_llist *list, struct Curl_llist_element *e,
                       const void *p,
                       struct Curl_llist_element *ne)
{
  ne->ptr = (void *) p;
  if(list->size == 0) {
    list->head = ne;
    list->head->prev = NULL;
    list->head->next = NULL;
    list->tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->next = e?e->next:list->head;
    ne->prev = e;
    if(!e) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if(e->next) {
      e->next->prev = ne;
    }
    else {
      list->tail = ne;
    }
    if(e)
      e->next = ne;
  }

  ++list->size;
}